

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::ResolveTargetsInGeneratorExpression
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,cmLocalGenerator *lg)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  cmLocalGenerator *this_00;
  char *pcVar8;
  char cVar9;
  ulong uVar10;
  string targetName_1;
  string errorString;
  string local_88;
  string local_68;
  cmGeneratorTarget *local_48;
  cmExportFileGenerator *local_40;
  cmLocalGenerator *local_38;
  
  local_48 = target;
  local_40 = this;
  local_38 = lg;
  lVar3 = std::__cxx11::string::find((char *)input,0x952ea6,0);
  cVar9 = (char)input;
  if (lVar3 != -1) {
    do {
      uVar10 = lVar3 + 0x12;
      uVar4 = std::__cxx11::string::find(cVar9,0x3e);
      uVar5 = std::__cxx11::string::find(cVar9,0x2c);
      uVar6 = std::__cxx11::string::find((char *)input,0x958b29,uVar10);
      if ((((uVar5 <= uVar6) && (uVar5 <= uVar4)) && (uVar4 != 0xffffffffffffffff)) &&
         (uVar5 != 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)input);
        bVar2 = AddTargetNamespace(local_40,&local_68,local_48,local_38);
        if (bVar2) {
          std::__cxx11::string::replace
                    ((ulong)input,uVar10,(char *)(uVar5 - uVar10),(ulong)local_68._M_dataplus._M_p);
        }
        sVar1 = local_68._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
        uVar10 = sVar1 + lVar3 + 0x13;
      }
      lVar3 = std::__cxx11::string::find((char *)input,0x952ea6,uVar10);
    } while (lVar3 != -1);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  uVar10 = 0;
  do {
    uVar4 = std::__cxx11::string::find((char *)input,0x928aef,uVar10);
    if (uVar4 == 0xffffffffffffffff) break;
    lVar3 = std::__cxx11::string::find(cVar9,0x3e);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_68,0,(char *)local_68._M_string_length,0x952eb9);
      break;
    }
    std::__cxx11::string::substr((ulong)&local_88,(ulong)input);
    lVar7 = std::__cxx11::string::find((char *)&local_88,0x958b29,0);
    pcVar8 = "$<TARGET_NAME:...> requires its parameter to be a literal.";
    if (lVar7 == -1) {
      bVar2 = AddTargetNamespace(local_40,&local_88,local_48,local_38);
      pcVar8 = "$<TARGET_NAME:...> requires its parameter to be a reachable target.";
      if (!bVar2) goto LAB_0057fd18;
      std::__cxx11::string::replace
                ((ulong)input,uVar4,(char *)((lVar3 - uVar4) + 1),(ulong)local_88._M_dataplus._M_p);
      uVar10 = local_88._M_string_length + uVar4;
      bVar2 = true;
    }
    else {
LAB_0057fd18:
      bVar2 = false;
      std::__cxx11::string::_M_replace
                ((ulong)&local_68,0,(char *)local_68._M_string_length,(ulong)pcVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  } while (bVar2);
  if ((char *)local_68._M_string_length == (char *)0x0) {
    uVar10 = 0;
    do {
      lVar3 = std::__cxx11::string::find((char *)input,0x919eaa,uVar10);
      if (lVar3 == -1) {
LAB_0057fe69:
        if ((char *)local_68._M_string_length == (char *)0x0) goto LAB_0057fedb;
        break;
      }
      lVar7 = std::__cxx11::string::find(cVar9,0x3e);
      if (lVar7 == -1) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_68,0,(char *)local_68._M_string_length,0x952f61);
        goto LAB_0057fe69;
      }
      std::__cxx11::string::substr((ulong)&local_88,(ulong)input);
      bVar2 = cmGeneratorExpression::IsValidTargetName(&local_88);
      if ((bVar2) && (bVar2 = AddTargetNamespace(local_40,&local_88,local_48,local_38), bVar2)) {
        std::__cxx11::string::replace
                  ((ulong)input,lVar3 + 0xcU,(char *)(lVar7 - (lVar3 + 0xcU)),
                   (ulong)local_88._M_dataplus._M_p);
      }
      sVar1 = local_88._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      uVar10 = lVar3 + sVar1 + 0xd;
    } while ((char *)local_68._M_string_length == (char *)0x0);
  }
  goto LAB_0057fe71;
  while( true ) {
    lVar7 = std::__cxx11::string::find(cVar9,0x3e);
    if (lVar7 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_68,0,(char *)local_68._M_string_length,0x952f98);
      break;
    }
    std::__cxx11::string::substr((ulong)&local_88,(ulong)input);
    bVar2 = cmGeneratorExpression::IsValidTargetName(&local_88);
    if ((bVar2) && (bVar2 = AddTargetNamespace(local_40,&local_88,local_48,local_38), bVar2)) {
      std::__cxx11::string::replace
                ((ulong)input,lVar3 + 0xfU,(char *)(lVar7 - (lVar3 + 0xfU)),
                 (ulong)local_88._M_dataplus._M_p);
    }
    sVar1 = local_88._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    uVar10 = sVar1 + lVar3 + 0x10;
    if ((char *)local_68._M_string_length != (char *)0x0) break;
LAB_0057fedb:
    lVar3 = std::__cxx11::string::find((char *)input,0x952f88,uVar10);
    if (lVar3 == -1) break;
  }
LAB_0057fe71:
  (*local_40->_vptr_cmExportFileGenerator[0x14])(local_40,input);
  if ((char *)local_68._M_string_length != (char *)0x0) {
    this_00 = cmGeneratorTarget::GetLocalGenerator(local_48);
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::ResolveTargetsInGeneratorExpression(
  std::string& input, cmGeneratorTarget const* target,
  cmLocalGenerator const* lg)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  while ((pos = input.find("$<TARGET_PROPERTY:", lastPos)) !=
         std::string::npos) {
    std::string::size_type nameStartPos = pos + cmStrLen("$<TARGET_PROPERTY:");
    std::string::size_type closePos = input.find('>', nameStartPos);
    std::string::size_type commaPos = input.find(',', nameStartPos);
    std::string::size_type nextOpenPos = input.find("$<", nameStartPos);
    if (commaPos == std::string::npos    // Implied 'this' target
        || closePos == std::string::npos // Incomplete expression.
        || closePos < commaPos           // Implied 'this' target
        || nextOpenPos < commaPos)       // Non-literal
    {
      lastPos = nameStartPos;
      continue;
    }

    std::string targetName =
      input.substr(nameStartPos, commaPos - nameStartPos);

    if (this->AddTargetNamespace(targetName, target, lg)) {
      input.replace(nameStartPos, commaPos - nameStartPos, targetName);
    }
    lastPos = nameStartPos + targetName.size() + 1;
  }

  std::string errorString;
  pos = 0;
  lastPos = pos;
  while ((pos = input.find("$<TARGET_NAME:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + cmStrLen("$<TARGET_NAME:");
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<TARGET_NAME:...> expression incomplete";
      break;
    }
    std::string targetName = input.substr(nameStartPos, endPos - nameStartPos);
    if (targetName.find("$<") != std::string::npos) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "literal.";
      break;
    }
    if (!this->AddTargetNamespace(targetName, target, lg)) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "reachable target.";
      break;
    }
    input.replace(pos, endPos - pos + 1, targetName);
    lastPos = pos + targetName.size();
  }

  pos = 0;
  lastPos = pos;
  while (errorString.empty() &&
         (pos = input.find("$<LINK_ONLY:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + cmStrLen("$<LINK_ONLY:");
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<LINK_ONLY:...> expression incomplete";
      break;
    }
    std::string libName = input.substr(nameStartPos, endPos - nameStartPos);
    if (cmGeneratorExpression::IsValidTargetName(libName) &&
        this->AddTargetNamespace(libName, target, lg)) {
      input.replace(nameStartPos, endPos - nameStartPos, libName);
    }
    lastPos = nameStartPos + libName.size() + 1;
  }

  while (errorString.empty() &&
         (pos = input.find("$<COMPILE_ONLY:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + cmStrLen("$<COMPILE_ONLY:");
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<COMPILE_ONLY:...> expression incomplete";
      break;
    }
    std::string libName = input.substr(nameStartPos, endPos - nameStartPos);
    if (cmGeneratorExpression::IsValidTargetName(libName) &&
        this->AddTargetNamespace(libName, target, lg)) {
      input.replace(nameStartPos, endPos - nameStartPos, libName);
    }
    lastPos = nameStartPos + libName.size() + 1;
  }

  this->ReplaceInstallPrefix(input);

  if (!errorString.empty()) {
    target->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                              errorString);
  }
}